

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dns.c
# Opt level: O0

int luv_getaddrinfo(lua_State *L)

{
  int iVar1;
  int status;
  lua_Integer lVar2;
  char *pcVar3;
  uv_getaddrinfo_t *req_00;
  luv_req_t *plVar4;
  uv_loop_t *loop;
  uv_getaddrinfo_cb cb;
  int protocol;
  int ref;
  int ret;
  addrinfo *hints;
  addrinfo hints_s;
  char *service;
  char *node;
  uv_getaddrinfo_t *req;
  lua_State *L_local;
  
  _ref = (addrinfo *)&hints;
  iVar1 = lua_type(L,1);
  if (iVar1 < 1) {
    service = (char *)0x0;
  }
  else {
    service = luaL_checklstring(L,1,(size_t *)0x0);
  }
  iVar1 = lua_type(L,2);
  if (iVar1 < 1) {
    hints_s.ai_next = (addrinfo *)0x0;
  }
  else {
    hints_s.ai_next = (addrinfo *)luaL_checklstring(L,2,(size_t *)0x0);
  }
  iVar1 = lua_type(L,3);
  if (iVar1 < 1) {
    _ref = (addrinfo *)0x0;
  }
  else {
    luaL_checktype(L,3,5);
  }
  if (_ref != (addrinfo *)0x0) {
    memset(_ref,0,0x30);
    lua_getfield(L,3,"family");
    iVar1 = lua_isnumber(L,-1);
    if (iVar1 == 0) {
      iVar1 = lua_isstring(L,-1);
      if (iVar1 == 0) {
        iVar1 = lua_type(L,-1);
        if (iVar1 == 0) {
          _ref->ai_family = 0;
        }
        else {
          luaL_argerror(L,3,"family hint must be string if set");
        }
      }
      else {
        pcVar3 = lua_tolstring(L,-1,(size_t *)0x0);
        iVar1 = luv_af_string_to_num(pcVar3);
        _ref->ai_family = iVar1;
      }
    }
    else {
      lVar2 = lua_tointegerx(L,-1,(int *)0x0);
      _ref->ai_family = (int)lVar2;
    }
    lua_settop(L,-2);
    lua_getfield(L,3,"socktype");
    iVar1 = lua_isnumber(L,-1);
    if (iVar1 == 0) {
      iVar1 = lua_isstring(L,-1);
      if (iVar1 == 0) {
        iVar1 = lua_type(L,-1);
        if (iVar1 != 0) {
          iVar1 = luaL_argerror(L,3,"socktype hint must be string if set");
          return iVar1;
        }
      }
      else {
        pcVar3 = lua_tolstring(L,-1,(size_t *)0x0);
        iVar1 = luv_sock_string_to_num(pcVar3);
        _ref->ai_socktype = iVar1;
      }
    }
    else {
      lVar2 = lua_tointegerx(L,-1,(int *)0x0);
      _ref->ai_socktype = (int)lVar2;
    }
    lua_settop(L,-2);
    lua_getfield(L,3,"protocol");
    iVar1 = lua_isnumber(L,-1);
    if (iVar1 == 0) {
      iVar1 = lua_isstring(L,-1);
      if (iVar1 == 0) {
        iVar1 = lua_type(L,-1);
        if (iVar1 != 0) {
          iVar1 = luaL_argerror(L,3,"protocol hint must be string if set");
          return iVar1;
        }
      }
      else {
        pcVar3 = lua_tolstring(L,-1,(size_t *)0x0);
        iVar1 = luv_af_string_to_num(pcVar3);
        if (iVar1 == 0) {
          iVar1 = luaL_argerror(L,3,"Invalid protocol hint");
          return iVar1;
        }
        _ref->ai_protocol = iVar1;
      }
    }
    else {
      lVar2 = lua_tointegerx(L,-1,(int *)0x0);
      _ref->ai_protocol = (int)lVar2;
    }
    lua_settop(L,-2);
    lua_getfield(L,3,"addrconfig");
    iVar1 = lua_toboolean(L,-1);
    if (iVar1 != 0) {
      _ref->ai_flags = _ref->ai_flags | 0x20;
    }
    lua_settop(L,-2);
    lua_getfield(L,3,"v4mapped");
    iVar1 = lua_toboolean(L,-1);
    if (iVar1 != 0) {
      _ref->ai_flags = _ref->ai_flags | 8;
    }
    lua_settop(L,-2);
    lua_getfield(L,3,"all");
    iVar1 = lua_toboolean(L,-1);
    if (iVar1 != 0) {
      _ref->ai_flags = _ref->ai_flags | 0x10;
    }
    lua_settop(L,-2);
    lua_getfield(L,3,"numerichost");
    iVar1 = lua_toboolean(L,-1);
    if (iVar1 != 0) {
      _ref->ai_flags = _ref->ai_flags | 4;
    }
    lua_settop(L,-2);
    lua_getfield(L,3,"passive");
    iVar1 = lua_toboolean(L,-1);
    if (iVar1 != 0) {
      _ref->ai_flags = _ref->ai_flags | 1;
    }
    lua_settop(L,-2);
    lua_getfield(L,3,"numericserv");
    iVar1 = lua_toboolean(L,-1);
    if ((iVar1 != 0) &&
       (_ref->ai_flags = _ref->ai_flags | 0x400, hints_s.ai_next == (addrinfo *)0x0)) {
      hints_s.ai_next = (addrinfo *)0x19b293;
    }
    lua_settop(L,-2);
    lua_getfield(L,3,"canonname");
    iVar1 = lua_toboolean(L,-1);
    if (iVar1 != 0) {
      _ref->ai_flags = _ref->ai_flags | 2;
    }
    lua_settop(L,-2);
  }
  iVar1 = luv_check_continuation(L,4);
  req_00 = (uv_getaddrinfo_t *)lua_newuserdata(L,0xa0);
  plVar4 = luv_setup_req(L,iVar1);
  req_00->data = plVar4;
  loop = luv_loop(L);
  cb = luv_getaddrinfo_cb;
  if (iVar1 == -2) {
    cb = (uv_getaddrinfo_cb)0x0;
  }
  status = uv_getaddrinfo(loop,req_00,cb,service,(char *)hints_s.ai_next,_ref);
  if (status < 0) {
    luv_cleanup_req(L,(luv_req_t *)req_00->data);
    lua_settop(L,-2);
    L_local._4_4_ = luv_error(L,status);
  }
  else {
    if (iVar1 == -2) {
      lua_settop(L,-2);
      luv_pushaddrinfo(L,req_00->addrinfo);
      uv_freeaddrinfo(req_00->addrinfo);
      luv_cleanup_req(L,(luv_req_t *)req_00->data);
    }
    L_local._4_4_ = 1;
  }
  return L_local._4_4_;
}

Assistant:

static int luv_getaddrinfo(lua_State* L) {
  uv_getaddrinfo_t* req;
  const char* node;
  const char* service;
  struct addrinfo hints_s;
  struct addrinfo* hints = &hints_s;
  int ret, ref;
  luv_ctx_t* ctx = luv_context(L);
  if (lua_isnoneornil(L, 1)) node = NULL;
  else node = luaL_checkstring(L, 1);
  if (lua_isnoneornil(L, 2)) service = NULL;
  else service = luaL_checkstring(L, 2);
  if (!lua_isnoneornil(L, 3)) luaL_checktype(L, 3, LUA_TTABLE);
  else hints = NULL;
  if (hints) {
    // Initialize the hints
    memset(hints, 0, sizeof(*hints));

    // Process the `family` hint.
    lua_getfield(L, 3, "family");
    if (lua_isnumber(L, -1)) {
      hints->ai_family = lua_tointeger(L, -1);
    }
    else if (lua_isstring(L, -1)) {
      hints->ai_family = luv_af_string_to_num(lua_tostring(L, -1));
    }
    else if (lua_isnil(L, -1)) {
      hints->ai_family = AF_UNSPEC;
    }
    else {
      luaL_argerror(L, 3, "family hint must be string if set");
    }
    lua_pop(L, 1);

    // Process `socktype` hint
    lua_getfield(L, 3, "socktype");
    if (lua_isnumber(L, -1)) {
      hints->ai_socktype = lua_tointeger(L, -1);
    }
    else if (lua_isstring(L, -1)) {
      hints->ai_socktype = luv_sock_string_to_num(lua_tostring(L, -1));
    }
    else if (!lua_isnil(L, -1)) {
      return luaL_argerror(L, 3, "socktype hint must be string if set");
    }
    lua_pop(L, 1);

    // Process the `protocol` hint
    lua_getfield(L, 3, "protocol");
    if (lua_isnumber(L, -1)) {
      hints->ai_protocol = lua_tointeger(L, -1);
    }
    else if (lua_isstring(L, -1)) {
      int protocol = luv_af_string_to_num(lua_tostring(L, -1));
      if (protocol) {
        hints->ai_protocol = protocol;
      }
      else {
        return luaL_argerror(L, 3, "Invalid protocol hint");
      }
    }
    else if (!lua_isnil(L, -1)) {
      return luaL_argerror(L, 3, "protocol hint must be string if set");
    }
    lua_pop(L, 1);

    lua_getfield(L, 3, "addrconfig");
    if (lua_toboolean(L, -1)) hints->ai_flags |=  AI_ADDRCONFIG;
    lua_pop(L, 1);

#ifdef AI_V4MAPPED
    lua_getfield(L, 3, "v4mapped");
    if (lua_toboolean(L, -1)) hints->ai_flags |=  AI_V4MAPPED;
    lua_pop(L, 1);
#endif

#ifdef AI_ALL
    lua_getfield(L, 3, "all");
    if (lua_toboolean(L, -1)) hints->ai_flags |=  AI_ALL;
    lua_pop(L, 1);
#endif

    lua_getfield(L, 3, "numerichost");
    if (lua_toboolean(L, -1)) hints->ai_flags |=  AI_NUMERICHOST;
    lua_pop(L, 1);

    lua_getfield(L, 3, "passive");
    if (lua_toboolean(L, -1)) hints->ai_flags |=  AI_PASSIVE;
    lua_pop(L, 1);

    lua_getfield(L, 3, "numericserv");
    if (lua_toboolean(L, -1)) {
        hints->ai_flags |=  AI_NUMERICSERV;
        /* On OS X upto at least OSX 10.9, getaddrinfo crashes
         * if AI_NUMERICSERV is set and the servname is NULL or "0".
         * This workaround avoids a segfault in libsystem.
         */
        if (NULL == service) service = "00";
    }
    lua_pop(L, 1);

    lua_getfield(L, 3, "canonname");
    if (lua_toboolean(L, -1)) hints->ai_flags |=  AI_CANONNAME;
    lua_pop(L, 1);
  }

  ref = luv_check_continuation(L, 4);
  req = (uv_getaddrinfo_t*)lua_newuserdata(L, sizeof(*req));
  req->data = luv_setup_req(L, ctx, ref);

  ret = uv_getaddrinfo(ctx->loop, req, ref == LUA_NOREF ? NULL : luv_getaddrinfo_cb, node, service, hints);
  if (ret < 0) {
    luv_cleanup_req(L, (luv_req_t*)req->data);
    lua_pop(L, 1);
    return luv_error(L, ret);
  }
  if (ref == LUA_NOREF) {

    lua_pop(L, 1);
    luv_pushaddrinfo(L, req->addrinfo);
    uv_freeaddrinfo(req->addrinfo);
    luv_cleanup_req(L, (luv_req_t*)req->data);
  }
  return 1;
}